

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzCompressEnd(bz_stream *strm)

{
  long *plVar1;
  EState *s;
  bz_stream *strm_local;
  
  if (strm == (bz_stream *)0x0) {
    strm_local._4_4_ = -2;
  }
  else {
    plVar1 = (long *)strm->state;
    if (plVar1 == (long *)0x0) {
      strm_local._4_4_ = -2;
    }
    else if ((bz_stream *)*plVar1 == strm) {
      if (plVar1[3] != 0) {
        (*strm->bzfree)(strm->opaque,(void *)plVar1[3]);
      }
      if (plVar1[4] != 0) {
        (*strm->bzfree)(strm->opaque,(void *)plVar1[4]);
      }
      if (plVar1[5] != 0) {
        (*strm->bzfree)(strm->opaque,(void *)plVar1[5]);
      }
      (*strm->bzfree)(strm->opaque,strm->state);
      strm->state = (void *)0x0;
      strm_local._4_4_ = 0;
    }
    else {
      strm_local._4_4_ = -2;
    }
  }
  return strm_local._4_4_;
}

Assistant:

int BZ_API(BZ2_bzCompressEnd)  ( bz_stream *strm )
{
   EState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = (EState *)strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   if (s->arr1 != NULL) BZFREE(s->arr1);
   if (s->arr2 != NULL) BZFREE(s->arr2);
   if (s->ftab != NULL) BZFREE(s->ftab);
   BZFREE(strm->state);

   strm->state = NULL;   

   return BZ_OK;
}